

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Helper.cpp
# Opt level: O3

void adios2::format::BP5Helper::GathervArraysTwoLevel
               (Comm *groupComm,Comm *groupLeaderComm,JSONProfiler *Profiler,uint64_t *MyContrib,
               size_t LocalSize,size_t *OverallRecvCounts,size_t OverallRecvCountsSize,
               uint64_t *OverallRecvBuffer,size_t DestRank)

{
  Comm *this;
  int iVar1;
  unsigned_long *n;
  pointer puVar2;
  size_type __new_size;
  long lVar3;
  unsigned_long source;
  vector<unsigned_long,_std::allocator<unsigned_long>_> RecvBuffer;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_170;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_158;
  Comm *local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_138 = groupLeaderComm;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ES_meta1","");
  profiling::JSONProfiler::Start(Profiler,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = helper::Comm::Size(groupComm);
  if (1 < iVar1) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ES_meta1_gather","");
    profiling::JSONProfiler::Start(Profiler,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    helper::Comm::GatherValues<unsigned_long>(&local_170,groupComm,LocalSize,0);
    iVar1 = helper::Comm::Rank(groupComm);
    if (iVar1 == 0) {
      __new_size = 0;
      for (puVar2 = local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar2 != local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
        __new_size = __new_size + *puVar2;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&local_158,__new_size);
    }
    helper::Comm::GathervArrays<unsigned_long>
              (groupComm,MyContrib,LocalSize,
               local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3,
               local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,0);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"ES_meta1_gather","");
    profiling::JSONProfiler::Stop(Profiler,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (size_t *)0x0) {
      operator_delete(local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"ES_meta1","");
  profiling::JSONProfiler::Stop(Profiler,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"ES_meta2","");
  profiling::JSONProfiler::Start(Profiler,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  iVar1 = helper::Comm::Rank(groupComm);
  this = local_138;
  if (iVar1 == 0) {
    lVar3 = (long)local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    iVar1 = helper::Comm::Size(local_138);
    if (iVar1 < 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"This should never happen",0x18);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
    }
    else {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"ES_meta2_gather","");
      profiling::JSONProfiler::Start(Profiler,&local_f0);
      source = lVar3 >> 3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      helper::Comm::GatherValues<unsigned_long>(&local_170,this,source,0);
      helper::Comm::GathervArrays<unsigned_long>
                (this,local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,source,
                 local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 (long)local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3,OverallRecvBuffer,0);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"ES_meta2_gather","");
      profiling::JSONProfiler::Stop(Profiler,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if (local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (size_t *)0x0) {
        operator_delete(local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"ES_meta2","");
  profiling::JSONProfiler::Stop(Profiler,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if (local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BP5Helper::GathervArraysTwoLevel(helper::Comm &groupComm, helper::Comm &groupLeaderComm,
                                      adios2::profiling::JSONProfiler &Profiler,
                                      uint64_t *MyContrib, size_t LocalSize,
                                      size_t *OverallRecvCounts, size_t OverallRecvCountsSize,
                                      uint64_t *OverallRecvBuffer, size_t DestRank)
{
    /*
     * Two-step aggregation of data that requires no intermediate processing
     */
    Profiler.Start("ES_meta1");
    std::vector<uint64_t> RecvBuffer;
    if (groupComm.Size() > 1)
    { // level 1
        Profiler.Start("ES_meta1_gather");
        std::vector<size_t> RecvCounts = groupComm.GatherValues(LocalSize, 0);
        if (groupComm.Rank() == 0)
        {
            uint64_t TotalSize = 0;
            for (auto &n : RecvCounts)
                TotalSize += n;
            RecvBuffer.resize(TotalSize);
            /*std::cout << "MD Lvl-1: rank " << m_Comm.Rank() << " gather "
                      << TotalSize << " bytes from aggregator group"
                      << std::endl;*/
        }
        groupComm.GathervArrays(MyContrib, LocalSize, RecvCounts.data(), RecvCounts.size(),
                                RecvBuffer.data(), 0);
        Profiler.Stop("ES_meta1_gather");
    } // level 1
    Profiler.Stop("ES_meta1");
    Profiler.Start("ES_meta2");
    // level 2
    if (groupComm.Rank() == 0)
    {
        std::vector<size_t> RecvCounts;
        size_t LocalSize = RecvBuffer.size();
        if (groupLeaderComm.Size() > 1)
        {
            Profiler.Start("ES_meta2_gather");
            RecvCounts = groupLeaderComm.GatherValues(LocalSize, 0);
            groupLeaderComm.GathervArrays(RecvBuffer.data(), LocalSize, RecvCounts.data(),
                                          RecvCounts.size(), OverallRecvBuffer, 0);
            Profiler.Stop("ES_meta2_gather");
        }
        else
        {
            std::cout << "This should never happen" << std::endl;
        }
    } // level 2
    Profiler.Stop("ES_meta2");
}